

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::StencilTest::initPrograms
          (StencilTest *this,SourceCollections *sourceCollections)

{
  SourceCollections *this_00;
  ProgramSources *pPVar1;
  allocator<char> local_111;
  string local_110;
  ShaderSource local_f0;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *sourceCollections_local;
  StencilTest *this_local;
  
  local_18 = sourceCollections;
  sourceCollections_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"color_vert",&local_39);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n\tgl_Position = position;\n\tvtxColor = color;\n}\n"
             ,&local_99);
  glu::VertexSource::VertexSource((VertexSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(pPVar1,&local_78);
  glu::VertexSource::~VertexSource((VertexSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"color_frag",&local_c1);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vtxColor;\n}\n"
             ,&local_111);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_f0,&local_110);
  glu::ProgramSources::operator<<(pPVar1,&local_f0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void StencilTest::initPrograms (SourceCollections& sourceCollections) const
{
	sourceCollections.glslSources.add("color_vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in vec4 position;\n"
		"layout(location = 1) in vec4 color;\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = position;\n"
		"	vtxColor = color;\n"
		"}\n");

	sourceCollections.glslSources.add("color_frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 vtxColor;\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"void main (void)\n"
		"{\n"
		"	fragColor = vtxColor;\n"
		"}\n");
}